

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR buf_store_char(lysp_yang_ctx *ctx,yang_arg arg,char **word_p,size_t *word_len,char **word_b,
                     size_t *buf_len,ly_bool need_buf,uint8_t *prefix)

{
  char **ppcVar1;
  size_t sVar2;
  size_t __size;
  LY_ERR LVar3;
  char *__dest;
  uint64_t *puVar4;
  ly_in *plVar5;
  size_t len;
  char **local_40;
  uint32_t c;
  
  local_40 = word_p;
  if (word_b == (char **)0x0 && need_buf != '\0') {
    __assert_fail("!need_buf || (need_buf && word_b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                  ,0xae,
                  "LY_ERR buf_store_char(struct lysp_yang_ctx *, enum yang_arg, char **, size_t *, char **, size_t *, ly_bool, uint8_t *)"
                 );
  }
  LVar3 = ly_getutf8(&ctx->in->current,&c,&len);
  if (LVar3 != LY_SUCCESS) {
    ly_vlog((ly_ctx *)
            **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
            (char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
            (ulong)(uint)(int)ctx->in->current[-len]);
    return LY_EVALID;
  }
  plVar5 = ctx->in;
  ppcVar1 = &plVar5->current;
  *ppcVar1 = *ppcVar1 + -len;
  puVar4 = &ctx->indent;
  if (c == 10) {
    *puVar4 = 0;
    puVar4 = &plVar5->line;
  }
  *puVar4 = *puVar4 + 1;
  if (arg - Y_STR_ARG < 2) {
    LVar3 = lysp_check_stringchar((lysp_ctx *)ctx,c);
LAB_0016a9ff:
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  }
  else {
    if (arg == Y_PREF_IDENTIF_ARG) {
      sVar2 = *word_len;
LAB_0016a9fa:
      LVar3 = lysp_check_identifierchar((lysp_ctx *)ctx,c,sVar2 == 0,prefix);
      goto LAB_0016a9ff;
    }
    if (arg == Y_IDENTIF_ARG) {
      sVar2 = *word_len;
      prefix = (uint8_t *)0x0;
      goto LAB_0016a9fa;
    }
  }
  if (word_b == (char **)0x0) {
LAB_0016aa82:
    plVar5 = ctx->in;
    if (*local_40 == (char *)0x0) {
      *local_40 = plVar5->current;
      plVar5 = ctx->in;
    }
    *word_len = *word_len + len;
    ly_in_skip(plVar5,len);
  }
  else {
    if (*word_b == (char *)0x0) {
      if (need_buf == '\0') goto LAB_0016aa82;
      __size = *word_len;
      if (__size != 0) {
        __dest = (char *)malloc(__size);
        *word_b = __dest;
        if (__dest == (char *)0x0) {
          ly_log((ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                 LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","buf_store_char");
          return LY_EMEM;
        }
        *buf_len = __size;
        memcpy(__dest,*local_40,*word_len);
      }
    }
    LVar3 = buf_add_char((ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],ctx->in,
                         len,word_b,buf_len,word_len);
    if (LVar3 != LY_SUCCESS) {
      return LY_EMEM;
    }
    *local_40 = *word_b;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
buf_store_char(struct lysp_yang_ctx *ctx, enum yang_arg arg, char **word_p, size_t *word_len,
        char **word_b, size_t *buf_len, ly_bool need_buf, uint8_t *prefix)
{
    uint32_t c;
    size_t len;

    /* check  valid combination of input paremeters - if need_buf specified, word_b must be provided */
    assert(!need_buf || (need_buf && word_b));

    /* get UTF8 code point (and number of bytes coding the character) */
    LY_CHECK_ERR_RET(ly_getutf8(&ctx->in->current, &c, &len),
            LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[-len]), LY_EVALID);
    ctx->in->current -= len;
    if (c == '\n') {
        ctx->indent = 0;
        LY_IN_NEW_LINE(ctx->in);
    } else {
        /* note - even the multibyte character is count as 1 */
        ++ctx->indent;
    }

    /* check character validity */
    switch (arg) {
    case Y_IDENTIF_ARG:
        LY_CHECK_RET(lysp_check_identifierchar((struct lysp_ctx *)ctx, c, !(*word_len), NULL));
        break;
    case Y_PREF_IDENTIF_ARG:
        LY_CHECK_RET(lysp_check_identifierchar((struct lysp_ctx *)ctx, c, !(*word_len), prefix));
        break;
    case Y_STR_ARG:
    case Y_MAYBE_STR_ARG:
        LY_CHECK_RET(lysp_check_stringchar((struct lysp_ctx *)ctx, c));
        break;
    }

    if (word_b && *word_b) {
        /* add another character into buffer */
        if (buf_add_char(PARSER_CTX(ctx), ctx->in, len, word_b, buf_len, word_len)) {
            return LY_EMEM;
        }

        /* in case of realloc */
        *word_p = *word_b;
    } else if (word_b && need_buf) {
        /* first time we need a buffer, copy everything read up to now */
        if (*word_len) {
            *word_b = malloc(*word_len);
            LY_CHECK_ERR_RET(!*word_b, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
            *buf_len = *word_len;
            memcpy(*word_b, *word_p, *word_len);
        }

        /* add this new character into buffer */
        if (buf_add_char(PARSER_CTX(ctx), ctx->in, len, word_b, buf_len, word_len)) {
            return LY_EMEM;
        }

        /* in case of realloc */
        *word_p = *word_b;
    } else {
        /* just remember the first character pointer */
        if (!*word_p) {
            *word_p = (char *)ctx->in->current;
        }
        /* ... and update the word's length */
        (*word_len) += len;
        ly_in_skip(ctx->in, len);
    }

    return LY_SUCCESS;
}